

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

bool cashew::JSPrinter::isBlock(Ref node)

{
  bool bVar1;
  Ref *this;
  Ref local_10;
  Ref node_local;
  
  if (((node.inst)->type == Array) &&
     (local_10.inst = node.inst, bVar1 = cashew::Value::empty(node.inst), !bVar1)) {
    this = Ref::operator[](&local_10,0);
    bVar1 = Ref::operator==(this,(IString *)BLOCK);
    return bVar1;
  }
  return false;
}

Assistant:

static bool isBlock(Ref node) {
    return node->isArray() && !node->empty() && node[0] == BLOCK;
  }